

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O1

GPU_Renderer * GPU_CreateRenderer(GPU_RendererID id)

{
  int iVar1;
  code *pcVar2;
  GPU_Renderer *pGVar3;
  long lVar4;
  int in_stack_00000010;
  
  pGVar3 = (GPU_Renderer *)0x0;
  lVar4 = 0;
  while ((iVar1 = *(int *)((long)&_gpu_renderer_register[0].id.renderer + lVar4), iVar1 == 0 ||
         (in_stack_00000010 != iVar1))) {
    lVar4 = lVar4 + 0x28;
    if (lVar4 == 400) {
LAB_0015a25e:
      if (pGVar3 == (GPU_Renderer *)0x0) {
        GPU_PushErrorCode("GPU_CreateRenderer",GPU_ERROR_DATA_ERROR,
                          "Renderer was not found in the renderer registry.");
      }
      return pGVar3;
    }
  }
  pcVar2 = *(code **)((long)&_gpu_renderer_register[0].createFn + lVar4);
  if (pcVar2 == (code *)0x0) {
    pGVar3 = (GPU_Renderer *)0x0;
  }
  else {
    pGVar3 = (GPU_Renderer *)(*pcVar2)();
  }
  goto LAB_0015a25e;
}

Assistant:

GPU_Renderer* GPU_CreateRenderer(GPU_RendererID id)
{
	GPU_Renderer* result = NULL;
	int i;
	for(i = 0; i < GPU_MAX_REGISTERED_RENDERERS; i++)
	{
		if(_gpu_renderer_register[i].id.renderer == GPU_RENDERER_UNKNOWN)
			continue;
		
		if(id.renderer == _gpu_renderer_register[i].id.renderer)
		{
			if(_gpu_renderer_register[i].createFn != NULL)
            {
                // Use the registered name
                id.name = _gpu_renderer_register[i].id.name;
				result = _gpu_renderer_register[i].createFn(id);
            }
			break;
		}
	}
	
	if(result == NULL)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "Renderer was not found in the renderer registry.");
    }
	return result;
}